

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O2

int __thiscall
CorUnix::CPalSynchronizationManager::ReadBytesFromProcessPipe
          (CPalSynchronizationManager *this,int iTimeout,BYTE *pRecvBuf,LONG iBytes)

{
  FILE *__stream;
  uint uVar1;
  BOOL BVar2;
  int iVar3;
  uint *puVar6;
  ssize_t sVar7;
  int *piVar8;
  char *pcVar9;
  uint __errnum;
  int iVar10;
  BYTE *local_48;
  pollfd local_40;
  pollfd Poll;
  int iVar4;
  int iVar5;
  
  Poll.fd = iBytes;
  if (iBytes < 0) {
    fprintf(_stderr,"] %s %s:%d","ReadBytesFromProcessPipe",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x75b);
    fprintf(_stderr,"Expression: 0 <= iBytes\n");
  }
  iVar10 = 0;
  Poll.events = 0;
  Poll.revents = 0;
  local_48 = pRecvBuf;
  do {
    while( true ) {
      local_40.fd = this->m_iProcessPipeRead;
      local_40.events = 1;
      local_40.revents = 0;
      uVar1 = poll(&local_40,1,iTimeout);
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00201af9;
      if (uVar1 != 1) break;
      if (((local_40._4_4_ & 0x380000) != 0) &&
         ((BVar2 = PALIsShuttingDown(), BVar2 == 0 || (local_40.revents != 0x10)))) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00201af9;
        uVar1 = 0xffffffff;
        __errnum = 0x16;
        goto LAB_00201a9a;
      }
      sVar7 = read(this->m_iProcessPipeRead,local_48,(long)(Poll.fd - Poll._4_4_));
      uVar1 = (uint)sVar7;
      if (uVar1 == 0) {
        if (PAL_InitializeChakraCoreCalled != false) {
          iVar10._0_2_ = Poll.events;
          iVar10._2_2_ = Poll.revents;
          return iVar10;
        }
LAB_00201af9:
        abort();
      }
      if ((int)uVar1 < 0) {
        if (PAL_InitializeChakraCoreCalled != false) {
          piVar8 = __errno_location();
          strerror(*piVar8);
          return uVar1;
        }
        goto LAB_00201af9;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00201af9;
      Poll._4_4_ = Poll._4_4_ + uVar1;
      local_48 = local_48 + (uVar1 & 0x7fffffff);
      if (Poll.fd <= (int)Poll._4_4_) {
        return Poll._4_4_;
      }
    }
    if (-1 < (int)uVar1) {
      if (uVar1 == 0) {
        iVar5._0_2_ = Poll.events;
        iVar5._2_2_ = Poll.revents;
        return iVar5;
      }
      fprintf(_stderr,"] %s %s:%d","ReadBytesFromProcessPipe",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
              ,0x7ef);
      fprintf(_stderr,"Unexpected return code %d from blocking poll/kevent call\n",(ulong)uVar1);
      iVar4._0_2_ = Poll.events;
      iVar4._2_2_ = Poll.revents;
      return iVar4;
    }
    puVar6 = (uint *)__errno_location();
    __errnum = *puVar6;
    if (__errnum != 4) {
LAB_00201a9a:
      fprintf(_stderr,"] %s %s:%d","ReadBytesFromProcessPipe",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
              ,0x7f7);
      __stream = _stderr;
      pcVar9 = strerror(__errnum);
      fprintf(__stream,"Unexpected error from blocking poll/kevent call: %d (%s)\n",(ulong)__errnum,
              pcVar9);
      return uVar1;
    }
    iVar10 = iVar10 + 1;
    if (0x7f < iVar10 && iTimeout != -1) {
      iVar3._0_2_ = Poll.events;
      iVar3._2_2_ = Poll.revents;
      return iVar3;
    }
  } while( true );
}

Assistant:

int CPalSynchronizationManager::ReadBytesFromProcessPipe(
        int iTimeout,
        BYTE * pRecvBuf,
        LONG iBytes)
    {
#if !HAVE_KQUEUE
        struct pollfd Poll;
#endif // !HAVE_KQUEUE
        int iRet = -1;
        int iConsecutiveEintrs = 0;
        LONG iBytesRead = 0;
        BYTE * pPos = pRecvBuf;
#if HAVE_KQUEUE && !HAVE_BROKEN_FIFO_KEVENT
        struct kevent keChanges;
        struct timespec ts, *pts;
        int iNChanges;
#endif // HAVE_KQUEUE

        _ASSERTE(0 <= iBytes);

        do
        {
            while (TRUE)
            {
                int iErrno = 0;
#if HAVE_KQUEUE
#if HAVE_BROKEN_FIFO_KEVENT
#if HAVE_BROKEN_FIFO_SELECT
#error Found no way to wait on a FIFO.
#endif

                timeval *ptv;
                timeval tv;

                if (INFTIM == iTimeout)
                {
                    ptv = NULL;
                }
                else
                {
                    tv.tv_usec = (iTimeout % tccSecondsToMillieSeconds) *
                        tccMillieSecondsToMicroSeconds;
                    tv.tv_sec = iTimeout / tccSecondsToMillieSeconds;
                    ptv = &tv;
                }

                fd_set readfds;
                FD_ZERO(&readfds);
                FD_SET(m_iProcessPipeRead, &readfds);
                iRet = select(m_iProcessPipeRead + 1, &readfds, NULL, NULL, ptv);

#else // HAVE_BROKEN_FIFO_KEVENT

                // Note: FreeBSD needs to use kqueue/kevent support here, since on this
                // platform the EOF notification on FIFOs is not surfaced through poll,
                // and process pipe shutdown relies on this feature.
                // If a thread is polling a FIFO or a pipe for POLLIN, when the last
                // write descriptor for that pipe is closed, poll() is supposed to
                // return with a POLLIN event but no data to be read on the FIFO/pipe,
                // which means EOF.
                // On FreeBSD such feature works for pipes but it doesn't for FIFOs.
                // Using kevent the EOF is instead surfaced correctly.

                if (iBytes > m_keProcessPipeEvent.data)
                {
                    if (INFTIM == iTimeout)
                    {
                        pts = NULL;
                    }
                    else
                    {
                        ts.tv_nsec = (iTimeout % tccSecondsToMillieSeconds) *
                            tccMillieSecondsToNanoSeconds;
                        ts.tv_sec = iTimeout / tccSecondsToMillieSeconds;
                        pts = &ts;
                    }

                    if (0 != (EV_EOF & m_keProcessPipeEvent.flags))
                    {
                        TRACE("Refreshing kevent settings\n");
                        EV_SET(&keChanges, m_iProcessPipeRead, EVFILT_READ,
                               EV_ADD | EV_CLEAR, 0, 0, 0);
                        iNChanges = 1;
                    }
                    else
                    {
                        iNChanges = 0;
                    }

                    iRet = kevent(m_iKQueue, &keChanges, iNChanges,
                                  &m_keProcessPipeEvent, 1, pts);

                    if (0 < iRet)
                    {
                        _ASSERTE(1 == iRet);
                        _ASSERTE(EVFILT_READ == m_keProcessPipeEvent.filter);

                        if (EV_ERROR & m_keProcessPipeEvent.flags)
                        {
                            ERROR("EV_ERROR from kevent [ident=%d filter=%d flags=%x]\n", m_keProcessPipeEvent.ident, m_keProcessPipeEvent.filter, m_keProcessPipeEvent.flags);
                            iRet = -1;
                            iErrno = m_keProcessPipeEvent.data;
                            m_keProcessPipeEvent.data = 0;
                        }
                    }
                    else if (0 > iRet)
                    {
                        iErrno = errno;
                    }

                    TRACE("Woken up from kevent() with ret=%d flags=%#x data=%d "
                          "[iTimeout=%d]\n", iRet, m_keProcessPipeEvent.flags,
                          m_keProcessPipeEvent.data, iTimeout);
                }
                else
                {
                    // There is enough data already available in the buffer,
                    // just use that.
                    iRet = 1;
                }

#endif // HAVE_BROKEN_FIFO_KEVENT
#else // HAVE_KQUEUE

                Poll.fd = m_iProcessPipeRead;
                Poll.events = POLLIN;
                Poll.revents = 0;

                iRet = poll(&Poll, 1, iTimeout);

                TRACE("Woken up from poll() with ret=%d [iTimeout=%d]\n",
                       iRet, iTimeout);

                if (1 == iRet &&
                    ((POLLERR | POLLHUP | POLLNVAL) & Poll.revents))
                {
                    // During PAL shutdown the pipe gets closed and Poll.revents is set to POLLHUP
                    // (note: no other flags are set). We will also receive an EOF on from the read call.
                    // Please see the comment for SynchWorkerCmdShutdown in CPalSynchronizationManager::WorkerThread.
                    if (!PALIsShuttingDown() || (Poll.revents != POLLHUP))
                    {
                        ERROR("Unexpected revents=%x while polling pipe %d\n",
                            Poll.revents, Poll.fd);
                        iErrno = EINVAL;
                        iRet = -1;
                    }
                }
                else if (0 > iRet)
                {
                    iErrno = errno;
                }

#endif // HAVE_KQUEUE

                if (0 == iRet || 1 == iRet)
                {
                    // 0 == wait timed out
                    // 1 == FIFO has data available
                    break;
                }
                else
                {
                    if (1 < iRet)
                    {
                        // Unexpected iRet > 1
                        ASSERT("Unexpected return code %d from blocking poll/kevent call\n",
                                iRet);
                        goto RBFPP_exit;
                    }

                    if (EINTR != iErrno)
                    {
                        // Unexpected error
                        ASSERT("Unexpected error from blocking poll/kevent call: %d (%s)\n",
                               iErrno, strerror(iErrno));
                        goto RBFPP_exit;
                    }

                    iConsecutiveEintrs++;
                    TRACE("poll() failed with EINTR; re-polling\n");

                    if (iConsecutiveEintrs >= MaxWorkerConsecutiveEintrs)
                    {
                        if (iTimeout != INFTIM)
                        {
                            WARN("Receiving too many EINTRs; converting one of them "
                                 "to a timeout");
                            iRet = 0;
                            break;
                        }
                        else if (0 == (iConsecutiveEintrs % MaxWorkerConsecutiveEintrs))
                        {
                            WARN("Receiving too many EINTRs [%d so far]",
                                 iConsecutiveEintrs);
                        }
                    }
                }
            }

            if (0 == iRet)
            {
                // Time out
                break;
            }
            else
            {
#if HAVE_KQUEUE && !HAVE_BROKEN_FIFO_KEVENT
                if (0 != (EV_EOF & m_keProcessPipeEvent.flags) && 0 == m_keProcessPipeEvent.data)
                {
                    // EOF
                    TRACE("Received an EOF on process pipe via kevent\n");
                    goto RBFPP_exit;
                }
#endif // HAVE_KQUEUE

                iRet = read(m_iProcessPipeRead, pPos, iBytes - iBytesRead);

                if (0 == iRet)
                {
                    // Poll returned 1 and read returned zero: this is an EOF,
                    // i.e. no other process has the pipe still open for write
                    TRACE("Received an EOF on process pipe via poll\n");
                    goto RBFPP_exit;
                }
                else if (0 > iRet)
                {
                    ERROR("Unable to read %d bytes from the the process pipe "
                          "[pipe=%d ret=%d errno=%d (%s)]\n", iBytes - iBytesRead,
                          m_iProcessPipeRead, iRet, errno, strerror(errno));
                    goto RBFPP_exit;
                }

                TRACE("Read %d bytes from process pipe\n", iRet);

                iBytesRead += iRet;
                pPos += iRet;

#if HAVE_KQUEUE && !HAVE_BROKEN_FIFO_KEVENT
                // Update available data count
                m_keProcessPipeEvent.data -= iRet;
                _ASSERTE(0 <= m_keProcessPipeEvent.data);
#endif // HAVE_KQUEUE
            }
        } while(iBytesRead < iBytes);

    RBFPP_exit:
        return (iRet < 0) ? iRet : iBytesRead;
    }